

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  undefined8 *puVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  fill_t<wchar_t> *fill;
  long lVar9;
  size_t size;
  wchar_t *pwVar10;
  ulong uVar11;
  ulong uVar12;
  size_t n;
  
  uVar12 = (ulong)(uint)specs->width;
  uVar11 = f->size_;
  uVar3 = uVar11;
  if (uVar12 != 0) {
    if (uVar11 == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      uVar7 = 0;
      do {
        uVar3 = uVar3 + 1;
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
    }
  }
  n = uVar12 - uVar3;
  if (uVar3 <= uVar12 && n != 0) {
    puVar1 = *(undefined8 **)this;
    lVar5 = puVar1[2];
    uVar11 = (specs->fill).size_ * n + uVar11 + lVar5;
    if ((ulong)puVar1[3] < uVar11) {
      (**(code **)*puVar1)(puVar1,uVar11);
    }
    puVar1[2] = uVar11;
    pwVar10 = (wchar_t *)(lVar5 * 4 + puVar1[1]);
    fill = &specs->fill;
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      pwVar10 = fill<wchar_t*,wchar_t>(pwVar10,n >> 1,fill);
      if (0 < (long)f->size_) {
        pcVar6 = f->s;
        lVar5 = f->size_ + 1;
        do {
          *pwVar10 = (int)*pcVar6;
          pcVar6 = pcVar6 + 1;
          pwVar10 = pwVar10 + 1;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      n = n - (n >> 1);
    }
    else {
      if (bVar2 == 2) {
        pwVar10 = fill<wchar_t*,wchar_t>(pwVar10,n,fill);
        if ((long)f->size_ < 1) {
          return;
        }
        pcVar6 = f->s;
        lVar5 = f->size_ + 1;
        lVar9 = 0;
        do {
          pwVar10[lVar9] = (int)pcVar6[lVar9];
          lVar5 = lVar5 + -1;
          lVar9 = lVar9 + 1;
        } while (1 < lVar5);
        return;
      }
      if (0 < (long)f->size_) {
        pcVar6 = f->s;
        lVar5 = f->size_ + 1;
        do {
          *pwVar10 = (int)*pcVar6;
          pcVar6 = pcVar6 + 1;
          pwVar10 = pwVar10 + 1;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
    }
    fill<wchar_t*,wchar_t>(pwVar10,n,fill);
    return;
  }
  puVar1 = *(undefined8 **)this;
  lVar5 = puVar1[2];
  uVar11 = uVar11 + lVar5;
  if ((ulong)puVar1[3] < uVar11) {
    (**(code **)*puVar1)(puVar1,uVar11);
  }
  puVar1[2] = uVar11;
  if (0 < (long)f->size_) {
    lVar9 = puVar1[1];
    pcVar6 = f->s;
    lVar4 = f->size_ + 1;
    lVar8 = 0;
    do {
      *(int *)(lVar5 * 4 + lVar9 + lVar8 * 4) = (int)pcVar6[lVar8];
      lVar4 = lVar4 + -1;
      lVar8 = lVar8 + 1;
    } while (1 < lVar4);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }